

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intvars.cc
# Opt level: O0

flat_integer_variables_valuations_range_t *
tchecker::flat_integer_variables_valuations_range
          (flat_integer_variables_valuations_range_t *__return_storage_ptr__,
          flat_integer_variables_t *intvars)

{
  end_iterator_t *peVar1;
  end_iterator_t *end;
  intvar_info_t *intvar_info;
  intvar_values_range_t local_84 [3];
  uint local_6c;
  undefined1 local_68 [4];
  intvar_id_t id;
  flat_integer_variables_valuations_iterator_t it;
  flat_integer_variables_t *intvars_local;
  
  it._its.
  super__Vector_base<tchecker::integer_iterator_t<int>,_std::allocator<tchecker::integer_iterator_t<int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)intvars;
  cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
  ::cartesian_iterator_t
            ((cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
              *)local_68);
  local_6c = 0;
  while( true ) {
    peVar1 = (end_iterator_t *)(ulong)local_6c;
    end = (end_iterator_t *)
          variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)it._its.
                    super__Vector_base<tchecker::integer_iterator_t<int>,_std::allocator<tchecker::integer_iterator_t<int>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (end <= peVar1) break;
    intvar_info = variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::info((variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)it._its.
                            super__Vector_base<tchecker::integer_iterator_t<int>,_std::allocator<tchecker::integer_iterator_t<int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,local_6c);
    local_84[0] = intvar_values_range(intvar_info);
    cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
    ::push_back((cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
                 *)local_68,local_84);
    local_6c = local_6c + 1;
  }
  make_range<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,tchecker::integer_iterator_t<int>>>,tchecker::end_iterator_t>
            (__return_storage_ptr__,(tchecker *)local_68,
             (cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
              *)&past_the_end_iterator,end);
  cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
  ::~cartesian_iterator_t
            ((cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
              *)local_68);
  return __return_storage_ptr__;
}

Assistant:

tchecker::flat_integer_variables_valuations_range_t
flat_integer_variables_valuations_range(tchecker::flat_integer_variables_t const & intvars)
{
  tchecker::flat_integer_variables_valuations_iterator_t it;
  for (tchecker::intvar_id_t id = 0; id < intvars.size(); ++id)
    it.push_back(tchecker::intvar_values_range(intvars.info(id)));
  return tchecker::make_range(it, tchecker::past_the_end_iterator);
}